

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O3

void GPU_RegisterRenderer
               (GPU_RendererID id,_func_GPU_Renderer_ptr_GPU_RendererID *create_renderer,
               _func_void_GPU_Renderer_ptr *free_renderer)

{
  GPU_RendererID GVar1;
  uint uVar2;
  long lVar3;
  char *details;
  
  GVar1 = id;
  gpu_init_renderer_register();
  uVar2 = 0;
  lVar3 = 8;
  do {
    uVar2 = (uVar2 + 1) - (uint)(*(int *)((long)&_gpu_renderer_register[0].id.name + lVar3) == 0);
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x198);
  if (uVar2 < 10) {
    if (id.renderer == 0) {
      details = "Invalid renderer ID";
    }
    else if (create_renderer == (_func_GPU_Renderer_ptr_GPU_RendererID *)0x0) {
      details = "NULL renderer create callback";
    }
    else {
      if (free_renderer != (_func_void_GPU_Renderer_ptr *)0x0) {
        _gpu_renderer_register[uVar2].id.minor_version = id.minor_version;
        *(undefined4 *)&_gpu_renderer_register[uVar2].id.field_0x14 = id._20_4_;
        _gpu_renderer_register[uVar2].id.name = id.name;
        _gpu_renderer_register[uVar2].id.renderer = (int)GVar1._8_8_;
        _gpu_renderer_register[uVar2].id.major_version = (int)((ulong)GVar1._8_8_ >> 0x20);
        _gpu_renderer_register[uVar2].createFn = create_renderer;
        _gpu_renderer_register[uVar2].freeFn = free_renderer;
        return;
      }
      details = "NULL renderer free callback";
    }
    GPU_PushErrorCode("GPU_RegisterRenderer",GPU_ERROR_USER_ERROR,details);
    return;
  }
  return;
}

Assistant:

void GPU_RegisterRenderer(GPU_RendererID id, GPU_Renderer* (*create_renderer)(GPU_RendererID request), void (*free_renderer)(GPU_Renderer* renderer))
{
    int i = GPU_GetNumRegisteredRenderers();
    
	if(i >= GPU_MAX_REGISTERED_RENDERERS)
		return;
    
    if(id.renderer == GPU_RENDERER_UNKNOWN)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Invalid renderer ID");
        return;
    }
    if(create_renderer == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "NULL renderer create callback");
        return;
    }
    if(free_renderer == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "NULL renderer free callback");
        return;
    }
    
    _gpu_renderer_register[i].id = id;
    _gpu_renderer_register[i].createFn = create_renderer;
    _gpu_renderer_register[i].freeFn = free_renderer;
}